

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O1

char * lys_stmt_str(ly_stmt stmt)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar2 = (char *)0x0;
  pcVar1 = (char *)0x0;
  if ((int)stmt < 0x160000) {
    if ((int)stmt < 0x30000) {
      if ((int)stmt < 0x200) {
        if ((int)stmt < 0x20) {
          switch(stmt) {
          case LY_STMT_NOTIFICATION:
            return "notification";
          case LY_STMT_INPUT:
            return "input";
          case LY_STMT_INPUT|LY_STMT_NOTIFICATION:
          case LY_STMT_OUTPUT|LY_STMT_NOTIFICATION:
          case LY_STMT_OUTPUT|LY_STMT_INPUT:
          case LY_STMT_OUTPUT|LY_STMT_INPUT|LY_STMT_NOTIFICATION:
            break;
          case LY_STMT_OUTPUT:
            return "output";
          case LY_STMT_ACTION:
            return "action";
          default:
            if (stmt == LY_STMT_RPC) {
              return "rpc";
            }
          }
        }
        else if ((int)stmt < 0x80) {
          if (stmt == LY_STMT_ANYDATA) {
            return "anydata";
          }
          if (stmt == LY_STMT_ANYXML) {
            return "anyxml";
          }
        }
        else {
          if (stmt == LY_STMT_AUGMENT) {
            return "augment";
          }
          if (stmt == LY_STMT_CASE) {
            return "case";
          }
        }
      }
      else if ((int)stmt < 0x2000) {
        if ((int)stmt < 0x800) {
          if (stmt == LY_STMT_CHOICE) {
            return "choice";
          }
          if (stmt == LY_STMT_CONTAINER) {
            return "container";
          }
        }
        else {
          if (stmt == LY_STMT_GROUPING) {
            return "grouping";
          }
          if (stmt == LY_STMT_LEAF) {
            return "leaf";
          }
        }
      }
      else if ((int)stmt < 0x8000) {
        if (stmt == LY_STMT_LEAF_LIST) {
          return "leaf-list";
        }
        if (stmt == LY_STMT_LIST) {
          return "list";
        }
      }
      else {
        if (stmt == LY_STMT_USES) {
          return "uses";
        }
        if (stmt == LY_STMT_ARGUMENT) {
          return "argument";
        }
        if (stmt == LY_STMT_BASE) {
          return "base";
        }
      }
    }
    else if ((int)stmt < 0xc0000) {
      if ((int)stmt < 0x70000) {
        if ((int)stmt < 0x50000) {
          if (stmt == LY_STMT_BELONGS_TO) {
            return "belongs-to";
          }
          if (stmt == LY_STMT_BIT) {
            return "bit";
          }
        }
        else {
          if (stmt == LY_STMT_CONFIG) {
            return "config";
          }
          if (stmt == LY_STMT_CONTACT) {
            return "contact";
          }
        }
      }
      else if ((int)stmt < 0x90000) {
        if (stmt == LY_STMT_DEFAULT) {
          return "default";
        }
        if (stmt == LY_STMT_DESCRIPTION) {
          return "description";
        }
      }
      else {
        if (stmt == LY_STMT_DEVIATE) {
          return "deviate";
        }
        if (stmt == LY_STMT_DEVIATION) {
          return "deviation";
        }
        if (stmt == LY_STMT_ENUM) {
          return "enum";
        }
      }
    }
    else if ((int)stmt < 0x110000) {
      if ((int)stmt < 0xe0000) {
        if (stmt == LY_STMT_ERROR_APP_TAG) {
          return "error-app-tag";
        }
        if (stmt == LY_STMT_ERROR_MESSAGE) {
          return "error-message";
        }
      }
      else {
        if (stmt == LY_STMT_EXTENSION) {
          return "extension";
        }
        if (stmt == LY_STMT_FEATURE) {
          return "feature";
        }
      }
    }
    else if ((int)stmt < 0x130000) {
      if (stmt == LY_STMT_FRACTION_DIGITS) {
        return "fraction-digits";
      }
      if (stmt == LY_STMT_IDENTITY) {
        return "identity";
      }
    }
    else {
      if (stmt == LY_STMT_IF_FEATURE) {
        return "if-feature";
      }
      if (stmt == LY_STMT_IMPORT) {
        return "import";
      }
      if (stmt == LY_STMT_INCLUDE) {
        return "include";
      }
    }
  }
  else if ((int)stmt < 0x290000) {
    if ((int)stmt < 0x1f0000) {
      if ((int)stmt < 0x1a0000) {
        if ((int)stmt < 0x180000) {
          if (stmt == LY_STMT_KEY) {
            return "key";
          }
          if (stmt == LY_STMT_LENGTH) {
            return "length";
          }
        }
        else {
          if (stmt == LY_STMT_MANDATORY) {
            return "mandatory";
          }
          if (stmt == LY_STMT_MAX_ELEMENTS) {
            return "max-elements";
          }
        }
      }
      else if ((int)stmt < 0x1c0000) {
        if (stmt == LY_STMT_MIN_ELEMENTS) {
          return "min-elements";
        }
        if (stmt == LY_STMT_MODIFIER) {
          return "modifier";
        }
      }
      else {
        if (stmt == LY_STMT_MODULE) {
          return "module";
        }
        if (stmt == LY_STMT_MUST) {
          return "must";
        }
        if (stmt == LY_STMT_NAMESPACE) {
          return "namespace";
        }
      }
    }
    else if ((int)stmt < 0x240000) {
      if ((int)stmt < 0x210000) {
        if (stmt == LY_STMT_ORDERED_BY) {
          return "ordered-by";
        }
        pcVar1 = pcVar2;
        if (stmt == LY_STMT_ORGANIZATION) {
          return "organization";
        }
      }
      else {
        if (stmt == LY_STMT_PATH) {
          return "path";
        }
        if (stmt == LY_STMT_PATTERN) {
          return "pattern";
        }
        pcVar1 = pcVar2;
        if (stmt == LY_STMT_POSITION) {
          return "position";
        }
      }
    }
    else if ((int)stmt < 0x260000) {
      if (stmt == LY_STMT_PREFIX) {
        return "prefix";
      }
      if (stmt == LY_STMT_PRESENCE) {
        return "presence";
      }
    }
    else {
      if (stmt == LY_STMT_RANGE) {
        return "range";
      }
      if (stmt == LY_STMT_REFERENCE) {
        return "reference";
      }
      pcVar1 = pcVar2;
      if (stmt == LY_STMT_REFINE) {
        return "refine";
      }
    }
  }
  else if ((int)stmt < 0x320000) {
    if ((int)stmt < 0x2d0000) {
      if ((int)stmt < 0x2b0000) {
        if (stmt == LY_STMT_REQUIRE_INSTANCE) {
          return "require-instance";
        }
        if (stmt == LY_STMT_REVISION) {
          return "revision";
        }
      }
      else {
        if (stmt == LY_STMT_REVISION_DATE) {
          return "revision-date";
        }
        if (stmt == LY_STMT_STATUS) {
          return "status";
        }
      }
    }
    else if ((int)stmt < 0x2f0000) {
      if (stmt == LY_STMT_SUBMODULE) {
        return "submodule";
      }
      if (stmt == LY_STMT_TYPE) {
        return "type";
      }
    }
    else {
      if (stmt == LY_STMT_TYPEDEF) {
        return "typedef";
      }
      if (stmt == LY_STMT_UNIQUE) {
        return "unique";
      }
      if (stmt == LY_STMT_UNITS) {
        return "units";
      }
    }
  }
  else if ((int)stmt < 0x350000) {
    if (stmt == LY_STMT_VALUE) goto switchD_00166910_caseD_350005;
    if (stmt == LY_STMT_WHEN) {
      return "when";
    }
    if (stmt == LY_STMT_YANG_VERSION) {
      return "yang-version";
    }
  }
  else {
    switch(stmt) {
    case LY_STMT_YIN_ELEMENT:
      pcVar1 = "yin-element";
      break;
    case LY_STMT_SYNTAX_SEMICOLON:
      return ";";
    case LY_STMT_SYNTAX_LEFT_BRACE:
      return "{";
    case LY_STMT_SYNTAX_RIGHT_BRACE:
      return "}";
    case LY_STMT_ARG_TEXT:
      return "text";
    case LY_STMT_ARG_VALUE:
switchD_00166910_caseD_350005:
      return "value";
    }
  }
  return pcVar1;
}

Assistant:

const char *
lys_stmt_str(enum ly_stmt stmt)
{
    switch (stmt) {
    case LY_STMT_NONE:
        return NULL;
    case LY_STMT_ACTION:
        return "action";
    case LY_STMT_ANYDATA:
        return "anydata";
    case LY_STMT_ANYXML:
        return "anyxml";
    case LY_STMT_ARGUMENT:
        return "argument";
    case LY_STMT_ARG_TEXT:
        return "text";
    case LY_STMT_ARG_VALUE:
        return "value";
    case LY_STMT_AUGMENT:
        return "augment";
    case LY_STMT_BASE:
        return "base";
    case LY_STMT_BELONGS_TO:
        return "belongs-to";
    case LY_STMT_BIT:
        return "bit";
    case LY_STMT_CASE:
        return "case";
    case LY_STMT_CHOICE:
        return "choice";
    case LY_STMT_CONFIG:
        return "config";
    case LY_STMT_CONTACT:
        return "contact";
    case LY_STMT_CONTAINER:
        return "container";
    case LY_STMT_DEFAULT:
        return "default";
    case LY_STMT_DESCRIPTION:
        return "description";
    case LY_STMT_DEVIATE:
        return "deviate";
    case LY_STMT_DEVIATION:
        return "deviation";
    case LY_STMT_ENUM:
        return "enum";
    case LY_STMT_ERROR_APP_TAG:
        return "error-app-tag";
    case LY_STMT_ERROR_MESSAGE:
        return "error-message";
    case LY_STMT_EXTENSION:
        return "extension";
    case LY_STMT_EXTENSION_INSTANCE:
        return NULL;
    case LY_STMT_FEATURE:
        return "feature";
    case LY_STMT_FRACTION_DIGITS:
        return "fraction-digits";
    case LY_STMT_GROUPING:
        return "grouping";
    case LY_STMT_IDENTITY:
        return "identity";
    case LY_STMT_IF_FEATURE:
        return "if-feature";
    case LY_STMT_IMPORT:
        return "import";
    case LY_STMT_INCLUDE:
        return "include";
    case LY_STMT_INPUT:
        return "input";
    case LY_STMT_KEY:
        return "key";
    case LY_STMT_LEAF:
        return "leaf";
    case LY_STMT_LEAF_LIST:
        return "leaf-list";
    case LY_STMT_LENGTH:
        return "length";
    case LY_STMT_LIST:
        return "list";
    case LY_STMT_MANDATORY:
        return "mandatory";
    case LY_STMT_MAX_ELEMENTS:
        return "max-elements";
    case LY_STMT_MIN_ELEMENTS:
        return "min-elements";
    case LY_STMT_MODIFIER:
        return "modifier";
    case LY_STMT_MODULE:
        return "module";
    case LY_STMT_MUST:
        return "must";
    case LY_STMT_NAMESPACE:
        return "namespace";
    case LY_STMT_NOTIFICATION:
        return "notification";
    case LY_STMT_ORDERED_BY:
        return "ordered-by";
    case LY_STMT_ORGANIZATION:
        return "organization";
    case LY_STMT_OUTPUT:
        return "output";
    case LY_STMT_PATH:
        return "path";
    case LY_STMT_PATTERN:
        return "pattern";
    case LY_STMT_POSITION:
        return "position";
    case LY_STMT_PREFIX:
        return "prefix";
    case LY_STMT_PRESENCE:
        return "presence";
    case LY_STMT_RANGE:
        return "range";
    case LY_STMT_REFERENCE:
        return "reference";
    case LY_STMT_REFINE:
        return "refine";
    case LY_STMT_REQUIRE_INSTANCE:
        return "require-instance";
    case LY_STMT_REVISION:
        return "revision";
    case LY_STMT_REVISION_DATE:
        return "revision-date";
    case LY_STMT_RPC:
        return "rpc";
    case LY_STMT_STATUS:
        return "status";
    case LY_STMT_SUBMODULE:
        return "submodule";
    case LY_STMT_SYNTAX_LEFT_BRACE:
        return "{";
    case LY_STMT_SYNTAX_RIGHT_BRACE:
        return "}";
    case LY_STMT_SYNTAX_SEMICOLON:
        return ";";
    case LY_STMT_TYPE:
        return "type";
    case LY_STMT_TYPEDEF:
        return "typedef";
    case LY_STMT_UNIQUE:
        return "unique";
    case LY_STMT_UNITS:
        return "units";
    case LY_STMT_USES:
        return "uses";
    case LY_STMT_VALUE:
        return "value";
    case LY_STMT_WHEN:
        return "when";
    case LY_STMT_YANG_VERSION:
        return "yang-version";
    case LY_STMT_YIN_ELEMENT:
        return "yin-element";
    }

    return NULL;
}